

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
::do_insert(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
           unsigned_long *value,time_point now,time_point expire_time)

{
  ulong uVar1;
  size_type sVar2;
  reference puVar3;
  reference e_00;
  iterator __x;
  _List_iterator<unsigned_long> _Var4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar5;
  element *e;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
  keyed_position;
  unsigned_long element_idx;
  unsigned_long *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  time_point now_local;
  
  uVar1 = *(ulong *)(this + 0x30);
  sVar2 = std::
          vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
          ::size((vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
                  *)(this + 0x38));
  if (sVar2 <= uVar1) {
    do_prune(this,now);
  }
  puVar3 = std::_List_iterator<unsigned_long>::operator*
                     ((_List_iterator<unsigned_long> *)(this + 0xb8));
  keyed_position.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
             )*puVar3;
  pVar5 = std::
          unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
          ::emplace<std::__cxx11::string_const&,unsigned_long&>
                    ((unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)(this + 0x50),key,(unsigned_long *)&keyed_position);
  std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
            ((list<unsigned_long,std::allocator<unsigned_long>> *)(this + 0xa0),
             (unsigned_long *)&keyed_position);
  e_00 = std::
         vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
         ::operator[]((vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
                       *)(this + 0x38),
                      (size_type)
                      keyed_position.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      ._M_cur);
  e_00->m_value = *value;
  (e_00->m_expire_time).__d.__r = (rep)expire_time.__d.__r;
  (e_00->m_lru_position)._M_node = *(_List_node_base **)(this + 0xb8);
  __x = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0xa0));
  _Var4 = std::prev<std::_List_iterator<unsigned_long>>(__x._M_node,1);
  (e_00->m_ttl_position)._M_node = _Var4._M_node;
  (e_00->m_keyed_position).
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (__node_type *)
            pVar5.first.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ;
  std::_List_iterator<unsigned_long>::operator++((_List_iterator<unsigned_long> *)(this + 0xb8));
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  do_access(this,e_00);
  return;
}

Assistant:

auto do_insert(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune(now);
        }
        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        m_ttl_list.emplace_back(element_idx);

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_expire_time    = expire_time;
        e.m_lru_position   = m_lru_end;
        e.m_ttl_position   = std::prev(m_ttl_list.end());
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        do_access(e);
    }